

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

RK_S32 mpi_dec_opt_v(void *ctx,char *next)

{
  char *pcVar1;
  MpiDecTestCmd *cmd;
  
  if (next != (char *)0x0) {
    pcVar1 = strchr(next,0x71);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0x250) = 1;
    }
    pcVar1 = strchr(next,0x66);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0x254) = 1;
    }
    return 1;
  }
  return 0;
}

Assistant:

RK_S32 mpi_dec_opt_v(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        if (strstr(next, "q"))
            cmd->quiet = 1;
        if (strstr(next, "f"))
            cmd->trace_fps = 1;

        return 1;
    }

    return 0;
}